

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O1

sds * duckdb_hll::sdssplitlen(char *s,ssize_t len,char *sep,int seplen,int *count)

{
  int iVar1;
  int iVar2;
  sds *__ptr;
  sds *ppcVar3;
  sds pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar10 = (ulong)(uint)seplen;
  if (-1 < len && 0 < seplen) {
    __ptr = (sds *)malloc(0x28);
    iVar8 = 0;
    if (__ptr != (sds *)0x0) {
      if (len != 0) {
        if ((long)(ulong)(seplen - 1) < len) {
          lVar7 = 0;
          iVar8 = 5;
          lVar6 = 0;
          uVar9 = 0;
          do {
            iVar1 = (int)uVar9;
            ppcVar3 = __ptr;
            if (iVar8 < iVar1 + 2) {
              iVar8 = iVar8 * 2;
              ppcVar3 = (sds *)realloc(__ptr,(long)iVar8 << 3);
              if (ppcVar3 == (sds *)0x0) goto LAB_0120d9b2;
            }
            __ptr = ppcVar3;
            if (((seplen == 1) && (s[lVar7] == *sep)) ||
               (iVar2 = bcmp(s + lVar7,sep,uVar10), lVar5 = lVar7, iVar2 == 0)) {
              pcVar4 = sdsnewlen(s + lVar6,lVar7 - lVar6);
              __ptr[iVar1] = pcVar4;
              if (pcVar4 == (sds)0x0) goto LAB_0120d9b2;
              uVar9 = (ulong)(iVar1 + 1);
              lVar5 = uVar10 + lVar7 + -1;
              lVar6 = lVar7 + uVar10;
            }
            lVar7 = lVar5 + 1;
          } while (lVar7 < (long)(len - (ulong)(seplen - 1)));
        }
        else {
          uVar9 = 0;
          lVar6 = 0;
        }
        pcVar4 = sdsnewlen(s + lVar6,len - lVar6);
        __ptr[(int)uVar9] = pcVar4;
        if (pcVar4 == (sds)0x0) {
LAB_0120d9b2:
          if (0 < (int)uVar9) {
            uVar10 = 0;
            do {
              sdsfree(__ptr[uVar10]);
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
          }
          free(__ptr);
          iVar8 = 0;
          __ptr = (sds *)0x0;
        }
        else {
          iVar8 = (int)uVar9 + 1;
        }
      }
      *count = iVar8;
      return __ptr;
    }
  }
  return (sds *)0x0;
}

Assistant:

sds *sdssplitlen(const char *s, ssize_t len, const char *sep, int seplen, int *count) {
    int elements = 0, slots = 5;
    long start = 0, j;
    sds *tokens;

    if (seplen < 1 || len < 0) return NULL;

    tokens = (sds*) malloc(sizeof(sds)*slots);
    if (tokens == NULL) return NULL;

    if (len == 0) {
        *count = 0;
        return tokens;
    }
    for (j = 0; j < (len-(seplen-1)); j++) {
        /* make sure there is room for the next element and the final one */
        if (slots < elements+2) {
            sds *newtokens;

            slots *= 2;
            newtokens = (sds*) realloc(tokens,sizeof(sds)*slots);
            if (newtokens == NULL) goto cleanup;
            tokens = newtokens;
        }
        /* search the separator */
        if ((seplen == 1 && *(s+j) == sep[0]) || (memcmp(s+j,sep,seplen) == 0)) {
            tokens[elements] = sdsnewlen(s+start,j-start);
            if (tokens[elements] == NULL) goto cleanup;
            elements++;
            start = j+seplen;
            j = j+seplen-1; /* skip the separator */
        }
    }
    /* Add the final element. We are sure there is room in the tokens array. */
    tokens[elements] = sdsnewlen(s+start,len-start);
    if (tokens[elements] == NULL) goto cleanup;
    elements++;
    *count = elements;
    return tokens;

cleanup:
    {
        int i;
        for (i = 0; i < elements; i++) sdsfree(tokens[i]);
        free(tokens);
        *count = 0;
        return NULL;
    }
}